

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::ServiceDescriptor::DebugStringWithOptions_abi_cxx11_
          (ServiceDescriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  DebugStringOptions *in_stack_000002e0;
  string *in_stack_000002e8;
  ServiceDescriptor *in_stack_000002f0;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  return in_RDI;
}

Assistant:

std::string ServiceDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(&contents, options);
  return contents;
}